

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

void HTS_Vocoder_excite_voiced_frame(HTS_Vocoder *v,double noise,double pulse,double *lpf)

{
  size_t sVar1;
  ulong uVar2;
  size_t center;
  size_t i;
  double *lpf_local;
  double pulse_local;
  double noise_local;
  HTS_Vocoder *v_local;
  
  sVar1 = v->excite_buff_size;
  if ((noise != 0.0) || (NAN(noise))) {
    for (i = 0; i < v->excite_buff_size; i = i + 1) {
      if (i == sVar1 - 1 >> 1) {
        uVar2 = (v->excite_buff_index + i) % v->excite_buff_size;
        v->excite_ring_buff[uVar2] = noise * (1.0 - lpf[i]) + v->excite_ring_buff[uVar2];
      }
      else {
        uVar2 = (v->excite_buff_index + i) % v->excite_buff_size;
        v->excite_ring_buff[uVar2] = noise * (0.0 - lpf[i]) + v->excite_ring_buff[uVar2];
      }
    }
  }
  if ((pulse != 0.0) || (NAN(pulse))) {
    for (i = 0; i < v->excite_buff_size; i = i + 1) {
      uVar2 = (v->excite_buff_index + i) % v->excite_buff_size;
      v->excite_ring_buff[uVar2] = pulse * lpf[i] + v->excite_ring_buff[uVar2];
    }
  }
  return;
}

Assistant:

static void HTS_Vocoder_excite_voiced_frame(HTS_Vocoder * v, double noise, double pulse, const double *lpf)
{
   size_t i;
   size_t center = (v->excite_buff_size - 1) / 2;

   if (noise != 0.0) {
      for (i = 0; i < v->excite_buff_size; i++) {
         if (i == center)
            v->excite_ring_buff[(v->excite_buff_index + i) % v->excite_buff_size] += noise * (1.0 - lpf[i]);
         else
            v->excite_ring_buff[(v->excite_buff_index + i) % v->excite_buff_size] += noise * (0.0 - lpf[i]);
      }
   }
   if (pulse != 0.0) {
      for (i = 0; i < v->excite_buff_size; i++)
         v->excite_ring_buff[(v->excite_buff_index + i) % v->excite_buff_size] += pulse * lpf[i];
   }
}